

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O0

char * callscrn_num_to_string
                 (char *string_buf,size_t string_buf_len,uint8_t *num_buf,size_t num_buf_len)

{
  char *pcVar1;
  ulong uStack_40;
  int pn_digit;
  size_t j;
  size_t i;
  char *pstr;
  size_t num_buf_len_local;
  uint8_t *num_buf_local;
  size_t string_buf_len_local;
  char *string_buf_local;
  
  uStack_40 = 0;
  i = (size_t)string_buf;
  for (j = 0; pcVar1 = (char *)i, j < num_buf_len; j = j + 1) {
    pcVar1 = (char *)(i + 1);
    *(char *)i = ""[(int)(uint)num_buf[j] >> 4];
    if (string_buf_len - 1 <= uStack_40 + 1) break;
    i = i + 2;
    *pcVar1 = ""[(int)(num_buf[j] & 0xf)];
    uStack_40 = uStack_40 + 2;
    pcVar1 = (char *)i;
    if (string_buf_len - 1 <= uStack_40) break;
  }
  i = (size_t)pcVar1;
  *(undefined1 *)i = 0;
  return string_buf;
}

Assistant:

char* callscrn_num_to_string(char *string_buf, size_t string_buf_len, uint8_t *num_buf, size_t num_buf_len) {
    char  *pstr = string_buf;
    size_t i, j;

    j = 0;

    for (i = 0; i < num_buf_len; i++) {
        int pn_digit = num_buf[i] >> 4;

        *pstr++ = pn_lut[pn_digit];
        j++;

        if (j >= (string_buf_len - 1)) break;

        pn_digit = num_buf[i] & 0x0f;
        *pstr++  = pn_lut[pn_digit];
        j++;

        if (j >= (string_buf_len - 1)) break;
    }

    *pstr = '\0';
    return string_buf;
}